

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O3

Node * __thiscall
SuffixTree::GeneralizedSuffixTree::InsertNode
          (GeneralizedSuffixTree *this,uint letter,uint string,uint pos)

{
  Node *parent;
  char *pcVar1;
  char cVar2;
  Node *pNVar3;
  char *pcVar4;
  uint uVar5;
  mapped_type *pmVar6;
  long lVar7;
  uint local_3c;
  int local_38;
  uint letter_local;
  
  local_3c = letter;
  letter_local = pos;
  if (this->active_length == 0) {
    __assert_fail("active_length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                  ,0x123,"Node *SuffixTree::GeneralizedSuffixTree::InsertNode(uint, uint, uint)");
  }
  pNVar3 = this->root;
  pcVar4 = this->nodes;
  uVar5 = this->nodes_num;
  this->nodes_num = uVar5 + 1;
  lVar7 = (ulong)uVar5 * 0x60;
  parent = (Node *)(pcVar4 + lVar7);
  pcVar1 = pcVar4 + lVar7;
  *(Node **)pcVar1 = this->active_node;
  *(Node **)(pcVar1 + 8) = pNVar3;
  *(Node **)(pcVar1 + 0x10) = parent;
  *(Node **)(pcVar1 + 0x18) = parent;
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  pcVar1[0x24] = '\0';
  pcVar1[0x25] = '\0';
  pcVar1[0x26] = '\0';
  pcVar1[0x27] = '\0';
  pcVar4 = pcVar4 + lVar7 + 0x58;
  *(char **)(pcVar4 + -0x30) = pcVar4;
  pcVar4[-0x28] = '\x01';
  pcVar4[-0x27] = '\0';
  pcVar4[-0x26] = '\0';
  pcVar4[-0x25] = '\0';
  pcVar4[-0x24] = '\0';
  pcVar4[-0x23] = '\0';
  pcVar4[-0x22] = '\0';
  pcVar4[-0x21] = '\0';
  pcVar4[-0x20] = '\0';
  pcVar4[-0x1f] = '\0';
  pcVar4[-0x1e] = '\0';
  pcVar4[-0x1d] = '\0';
  pcVar4[-0x1c] = '\0';
  pcVar4[-0x1b] = '\0';
  pcVar4[-0x1a] = '\0';
  pcVar4[-0x19] = '\0';
  pcVar4[-0x18] = '\0';
  pcVar4[-0x17] = '\0';
  pcVar4[-0x16] = '\0';
  pcVar4[-0x15] = '\0';
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  pcVar4[-0x10] = '\0';
  pcVar4[-0xf] = '\0';
  pcVar4[-0xe] = -0x80;
  pcVar4[-0xd] = '?';
  pcVar4[-8] = '\0';
  pcVar4[-7] = '\0';
  pcVar4[-6] = '\0';
  pcVar4[-5] = '\0';
  pcVar4[-4] = '\0';
  pcVar4[-3] = '\0';
  pcVar4[-2] = '\0';
  pcVar4[-1] = '\0';
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  pmVar6 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->active_node->edges,&this->active_edge);
  uVar5 = pmVar6->start + this->active_length;
  if (pmVar6->length == 0) {
    cVar2 = (this->strings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[pmVar6->string_number]._M_dataplus._M_p[uVar5]
    ;
    local_38 = pmVar6->string_number << 8;
    if (cVar2 != '\0') {
      local_38 = (int)cVar2;
    }
  }
  else {
    cVar2 = (this->strings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[pmVar6->string_number]._M_dataplus._M_p[uVar5]
    ;
    local_38 = pmVar6->string_number << 8;
    if (cVar2 != '\0') {
      local_38 = (int)cVar2;
    }
  }
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int,SuffixTree::Edge>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(pcVar1 + 0x28));
  ((pmVar6->field_0).node)->parent = parent;
  AllocLeaf(this,parent,string);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,SuffixTree::Edge>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(pcVar1 + 0x28),&local_3c);
  (pmVar6->field_0).node = parent;
  pmVar6->length = this->active_length;
  return parent;
}

Assistant:

Node *GeneralizedSuffixTree::InsertNode (uint letter, uint string, uint pos)
{
    // can not insert node if active point is not on edge
    assert (active_length);
    // create node
    Node *node = AllocNode (active_node, root);
    Edge &edge = active_node->edges[active_edge];
    // old branch
    uint old_pos = edge.start + active_length;
    if (edge.length)
    {
        node->edges.emplace (MakeLetter (strings[edge.string_number][old_pos], edge.string_number),
                             Edge (edge.node, edge.string_number, old_pos, edge.length - active_length));
        edge.node->parent = node;
    }
    else
    {
        node->edges.emplace (MakeLetter (strings[edge.string_number][old_pos], edge.string_number),
                             Edge (edge.leaf, edge.string_number, old_pos));
        edge.leaf->parent = node;
    }
    // new leaf
    node->edges.emplace (letter, Edge (AllocLeaf (node, string), string, pos));
    // setup parent
    edge.node = node;
    edge.length = active_length;
    return node;
}